

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O2

void scp::_scp::bitReversal<std::complex<double>>
               (complex<double> *beg,uint64_t stride,uint64_t size,uint8_t bitCount)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  ulong n;
  complex<double> *pcVar5;
  
  pcVar5 = beg + stride;
  for (n = 1; n < size; n = n + 1) {
    uVar4 = reverse(n,bitCount);
    if (n < uVar4) {
      uVar1 = *(undefined8 *)pcVar5->_M_value;
      uVar2 = *(undefined8 *)(pcVar5->_M_value + 8);
      uVar3 = *(undefined8 *)(beg[uVar4 * stride]._M_value + 8);
      *(undefined8 *)pcVar5->_M_value = *(undefined8 *)beg[uVar4 * stride]._M_value;
      *(undefined8 *)(pcVar5->_M_value + 8) = uVar3;
      *(undefined8 *)beg[uVar4 * stride]._M_value = uVar1;
      *(undefined8 *)(beg[uVar4 * stride]._M_value + 8) = uVar2;
    }
    pcVar5 = pcVar5 + stride;
  }
  return;
}

Assistant:

constexpr void bitReversal(TValue* beg, uint64_t stride, uint64_t size, uint8_t bitCount)
		{
			TValue* it = beg + stride;
			for (uint64_t i = 1; i < size; ++i, it += stride)
			{
				uint64_t r = reverse(i, bitCount);
				if (r > i)
				{
					std::swap(*it, *(beg + r * stride));
				}
			}
		}